

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall SynthWidget::on_detailsButton_clicked(SynthWidget *this)

{
  int iVar1;
  QFrame *pQVar2;
  QIcon *pQVar3;
  long lVar4;
  int iVar5;
  Master *this_00;
  QSettings *pQVar6;
  long *plVar7;
  QWidget *this_01;
  QSize QVar8;
  QSize *pQVar9;
  int iVar10;
  QWidget *p;
  short sVar11;
  bool visible;
  QSize newSize;
  QArrayDataPointer<char16_t> QStack_58;
  anon_union_24_3_e3d07ef4_for_data local_40;
  
  pQVar2 = (this->ui->super_Ui_SynthWidget).detailsFrame;
  sVar11 = (short)*(undefined4 *)(*(long *)(pQVar2 + 0x20) + 8);
  visible = -1 < sVar11;
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,visible);
  pQVar3 = (QIcon *)(this->ui->super_Ui_SynthWidget).detailsButton;
  getSynthDetailsIcon(visible);
  QAbstractButton::setIcon(pQVar3);
  this_00 = Master::getInstance();
  pQVar6 = Master::getSettings(this_00);
  QString::QString((QString *)&QStack_58,"Master/showSynthDetails");
  QVariant::QVariant((QVariant *)&local_40,visible);
  QSettings::setValue((QString *)pQVar6,(QVariant *)&QStack_58);
  QVariant::~QVariant((QVariant *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  lVar4 = *(long *)((this->ui->super_Ui_SynthWidget).detailsFrame + 0x20);
  iVar10 = *(int *)(lVar4 + 0x20);
  iVar1 = *(int *)(lVar4 + 0x18);
  plVar7 = (long *)QWidget::layout();
  iVar5 = (**(code **)(*plVar7 + 0x60))(plVar7);
  iVar10 = (iVar10 - iVar1) + iVar5 + 1;
  if (sVar11 < 0) {
    for (; this != (SynthWidget *)0x0; this = *(SynthWidget **)(*(long *)&this->field_0x8 + 0x10)) {
      QWidget::updateGeometry();
    }
    iVar10 = -iVar10;
    QWidget::layout();
    QLayout::activate();
    QWidget::window();
    QWidget::layout();
    QLayout::activate();
  }
  this_01 = (QWidget *)QWidget::window();
  QVar8 = QWidget::size(this_01);
  local_40._0_4_ = QVar8.wd;
  local_40._4_4_ = QVar8.ht + iVar10;
  pQVar9 = (QSize *)QWidget::window();
  QWidget::resize(pQVar9);
  return;
}

Assistant:

void SynthWidget::on_detailsButton_clicked() {
	bool newVisible = !ui->detailsFrame->isVisible();
	ui->detailsFrame->setVisible(newVisible);
	ui->detailsButton->setIcon(SynthWidget::getSynthDetailsIcon(newVisible));
	Master::getInstance()->getSettings()->setValue("Master/showSynthDetails", newVisible);

	// Adjust size of main window
	int heightDelta = ui->detailsFrame->height() + layout()->spacing();
	if (!newVisible) {
		heightDelta = -heightDelta;

		// Enforce relayout of widget hierarchy up to the main window to allow its shrinking
		QWidget *p = this;
		while (p != NULL) {
			p->updateGeometry();
			p = p->parentWidget();
		}
		layout()->activate();
		window()->layout()->activate();
	}

	// OK, widgets' layouts updated, now resize main window
	QSize newSize = window()->size();
	newSize.rheight() += heightDelta;
	window()->resize(newSize);
}